

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O3

void __thiscall N::histo(N *this,Alg<void> *alg,vector<N_*,_std::allocator<N_*>_> *line)

{
  pointer *pppNVar1;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var2;
  undefined8 uVar3;
  _Any_data local_70;
  code *local_60;
  vector<N_*,_std::allocator<N_*>_> local_50;
  N *local_38 [4];
  
  local_38[0] = this;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,__gnu_cxx::__ops::_Iter_equals_val<N*const>>
                    ((line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var2._M_current ==
      (line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_38[0] = this;
    std::vector<N*,std::allocator<N*>>::emplace_back<N*>
              ((vector<N*,std::allocator<N*>> *)line,local_38);
    all(this);
    std::function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)>::function
              ((function<void_(N_&,_std::vector<N_*,_std::allocator<N_*>_>_&)> *)&local_70,alg);
    std::vector<N_*,_std::allocator<N_*>_>::vector(&local_50,line);
    CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>::
    foreach<N::histo(std::function<void(N&,std::vector<N*,std::allocator<N*>>&)>const&,std::vector<N*,std::allocator<N*>>)::_lambda(N*)_1_>
              ((CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N> *)
               local_38,(anon_class_56_2_7ce43dd9 *)&local_70);
    if (local_50.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    pppNVar1 = &(line->super__Vector_base<N_*,_std::allocator<N_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + -1;
  }
  if ((alg->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*alg->_M_invoker)((_Any_data *)alg,this,line);
    return;
  }
  uVar3 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar3);
}

Assistant:

void histo(const alg::Alg<void>& alg, vector<N*> line = {}) {
        if (find(line.begin(), line.end(), this) != line.end()) return alg(*this, line);
        line.push_back(this);

        this->all().foreach([alg, line](N* n){n->histo(alg, line);});

        line.pop_back();
        return alg(*this, line);
    }